

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

SharedPtr<deqp::egl::GLES2ThreadTest::Shader> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popShader(GLES2ResourceManager *this,int index)

{
  int *piVar1;
  SharedPtrStateBase *pSVar2;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
  *this_00;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  pointer pSVar3;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> SVar4;
  
  pSVar3 = *(pointer *)(CONCAT44(in_register_00000034,index) + 0x30);
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
             *)(CONCAT44(in_register_00000034,index) + 0x30);
  (this->m_textures).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar3[in_EDX].m_ptr;
  pSVar2 = pSVar3[in_EDX].m_state;
  (this->m_textures).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)((long)&((this->m_textures).
                             super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->m_state + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    pSVar3 = (this_00->
             super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
  ::_M_erase(this_00,pSVar3 + in_EDX);
  SVar4.m_state = extraout_RDX;
  SVar4.m_ptr = (Shader *)this;
  return SVar4;
}

Assistant:

SharedPtr<Shader> GLES2ResourceManager::popShader (int index)
{
	SharedPtr<Shader> shader = m_shaders[index];

	m_shaders.erase(m_shaders.begin() + index);

	return shader;
}